

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_implementation.hpp
# Opt level: O0

event_queue_t * __thiscall
so_5::disp::thread_pool::common_implementation::
dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,_so_5::disp::thread_pool::impl::agent_queue_t,_so_5::disp::thread_pool::bind_params_t,_so_5::disp::thread_pool::impl::adaptation_t>
::bind_agent_with_cooperation_fifo
          (dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,_so_5::disp::thread_pool::impl::agent_queue_t,_so_5::disp::thread_pool::bind_params_t,_so_5::disp::thread_pool::impl::adaptation_t>
           *this,agent_ref_t *agent,bind_params_t *params)

{
  anon_class_24_3_386d7799 main_action;
  anon_class_16_2_515617ac rollback_action;
  bool bVar1;
  agent_t *paVar2;
  string *psVar3;
  prefix_t *data_source_name_prefix;
  string *coop_name;
  pointer ppVar4;
  agent_queue_t *paVar5;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,_so_5::disp::thread_pool::impl::agent_queue_t,_so_5::disp::thread_pool::bind_params_t,_so_5::disp::thread_pool::impl::adaptation_t>::cooperation_data_t>_>,_bool>
  pVar6;
  undefined1 local_60 [32];
  _Base_ptr local_40;
  undefined1 local_38;
  _Self local_30;
  _Self local_28;
  iterator it;
  bind_params_t *params_local;
  agent_ref_t *agent_local;
  dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,_so_5::disp::thread_pool::impl::agent_queue_t,_so_5::disp::thread_pool::bind_params_t,_so_5::disp::thread_pool::impl::adaptation_t>
  *this_local;
  
  it._M_node = (_Base_ptr)params;
  paVar2 = intrusive_ptr_t<so_5::agent_t>::operator->(agent);
  psVar3 = agent_t::so_coop_name_abi_cxx11_(paVar2);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,_so_5::disp::thread_pool::impl::agent_queue_t,_so_5::disp::thread_pool::bind_params_t,_so_5::disp::thread_pool::impl::adaptation_t>::cooperation_data_t,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,_so_5::disp::thread_pool::impl::agent_queue_t,_so_5::disp::thread_pool::bind_params_t,_so_5::disp::thread_pool::impl::adaptation_t>::cooperation_data_t>_>_>
       ::find(&this->m_cooperations,psVar3);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,_so_5::disp::thread_pool::impl::agent_queue_t,_so_5::disp::thread_pool::bind_params_t,_so_5::disp::thread_pool::impl::adaptation_t>::cooperation_data_t,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,_so_5::disp::thread_pool::impl::agent_queue_t,_so_5::disp::thread_pool::bind_params_t,_so_5::disp::thread_pool::impl::adaptation_t>::cooperation_data_t>_>_>
       ::end(&this->m_cooperations);
  bVar1 = std::operator==(&local_28,&local_30);
  if (bVar1) {
    paVar2 = intrusive_ptr_t<so_5::agent_t>::operator->(agent);
    psVar3 = agent_t::so_coop_name_abi_cxx11_(paVar2);
    make_new_agent_queue
              ((dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,_so_5::disp::thread_pool::impl::agent_queue_t,_so_5::disp::thread_pool::bind_params_t,_so_5::disp::thread_pool::impl::adaptation_t>
                *)local_60,(bind_params_t *)this);
    data_source_name_prefix = reuse::thread_pool_stats::data_source_t::prefix(&this->m_data_source);
    paVar2 = intrusive_ptr_t<so_5::agent_t>::operator->(agent);
    coop_name = agent_t::so_coop_name_abi_cxx11_(paVar2);
    cooperation_data_t::cooperation_data_t
              ((cooperation_data_t *)(local_60 + 8),(agent_queue_ref_t *)local_60,1,
               data_source_name_prefix,coop_name);
    pVar6 = std::
            map<std::__cxx11::string,so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,so_5::disp::thread_pool::impl::agent_queue_t,so_5::disp::thread_pool::bind_params_t,so_5::disp::thread_pool::impl::adaptation_t>::cooperation_data_t,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,so_5::disp::thread_pool::impl::agent_queue_t,so_5::disp::thread_pool::bind_params_t,so_5::disp::thread_pool::impl::adaptation_t>::cooperation_data_t>>>
            ::
            emplace<std::__cxx11::string_const&,so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,so_5::disp::thread_pool::impl::agent_queue_t,so_5::disp::thread_pool::bind_params_t,so_5::disp::thread_pool::impl::adaptation_t>::cooperation_data_t>
                      ((map<std::__cxx11::string,so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,so_5::disp::thread_pool::impl::agent_queue_t,so_5::disp::thread_pool::bind_params_t,so_5::disp::thread_pool::impl::adaptation_t>::cooperation_data_t,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,so_5::disp::thread_pool::impl::agent_queue_t,so_5::disp::thread_pool::bind_params_t,so_5::disp::thread_pool::impl::adaptation_t>::cooperation_data_t>>>
                        *)&this->m_cooperations,psVar3,(cooperation_data_t *)(local_60 + 8));
    local_40 = (_Base_ptr)pVar6.first._M_node;
    local_38 = pVar6.second;
    local_28._M_node = local_40;
    cooperation_data_t::~cooperation_data_t((cooperation_data_t *)(local_60 + 8));
    intrusive_ptr_t<so_5::disp::thread_pool::impl::agent_queue_t>::~intrusive_ptr_t
              ((intrusive_ptr_t<so_5::disp::thread_pool::impl::agent_queue_t> *)local_60);
  }
  else {
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,_so_5::disp::thread_pool::impl::agent_queue_t,_so_5::disp::thread_pool::bind_params_t,_so_5::disp::thread_pool::impl::adaptation_t>::cooperation_data_t>_>
             ::operator->(&local_28);
    (ppVar4->second).m_agents = (ppVar4->second).m_agents + 1;
  }
  rollback_action.this = this;
  rollback_action.it = &local_28;
  main_action.agent = agent;
  main_action.this = this;
  main_action.it = &local_28;
  details::
  do_with_rollback_on_exception<so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,so_5::disp::thread_pool::impl::agent_queue_t,so_5::disp::thread_pool::bind_params_t,so_5::disp::thread_pool::impl::adaptation_t>::bind_agent_with_cooperation_fifo(so_5::intrusive_ptr_t<so_5::agent_t>,so_5::disp::thread_pool::bind_params_t_const&)::_lambda()_1_,so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,so_5::disp::thread_pool::impl::agent_queue_t,so_5::disp::thread_pool::bind_params_t,so_5::disp::thread_pool::impl::adaptation_t>::bind_agent_with_cooperation_fifo(so_5::intrusive_ptr_t<so_5::agent_t>,so_5::disp::thread_pool::bind_params_t_const&)::_lambda()_2_>
            (main_action,rollback_action);
  ppVar4 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,_so_5::disp::thread_pool::impl::agent_queue_t,_so_5::disp::thread_pool::bind_params_t,_so_5::disp::thread_pool::impl::adaptation_t>::cooperation_data_t>_>
           ::operator->(&local_28);
  paVar5 = intrusive_ptr_t<so_5::disp::thread_pool::impl::agent_queue_t>::get
                     (&(ppVar4->second).m_queue);
  return &paVar5->super_event_queue_t;
}

Assistant:

event_queue_t *
		bind_agent_with_cooperation_fifo(
			agent_ref_t agent,
			const PARAMS & params )
			{
				auto it = m_cooperations.find( agent->so_coop_name() );
				if( it == m_cooperations.end() )
					it = m_cooperations.emplace(
							agent->so_coop_name(),
							cooperation_data_t(
									make_new_agent_queue( params ),
									1,
									m_data_source.prefix(),
									agent->so_coop_name() ) )
							.first;
				else
					it->second.m_agents += 1;

				so_5::details::do_with_rollback_on_exception(
						[&] {
							m_agents.emplace(
									agent.get(),
									agent_data_t{ it->second.m_queue } );
						},
						[&] {
							// Rollback m_cooperations modification.
							if( 0 == --(it->second.m_agents) )
								m_cooperations.erase( it );
						} );

				return it->second.m_queue.get();
			}